

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

string * __thiscall
fmt::v7::detail::vformat_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,string_view format_str,format_args args)

{
  size_t sVar1;
  handle h;
  char *pcVar2;
  type tVar3;
  string *result;
  ptrdiff_t _Num;
  ulong __n;
  basic_string_view<char> format_str_00;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_00;
  uint local_278;
  undefined4 uStack_274;
  undefined2 uStack_270;
  undefined6 uStack_26e;
  stringifier local_259;
  buffer<char> local_258;
  undefined1 local_238 [544];
  
  args_00.field_1 =
       (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
        )args.
         super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
         .desc_;
  args_00.desc_ = format_str.size_;
  format_str_00.size_ = format_str.data_;
  if ((format_str_00.size_ == (char *)0x2) && (*(short *)this == 0x7d7b)) {
    local_278 = 0;
    if ((long)args_00.desc_ < 0) {
      if ((int)(type)format_str.size_ < 1) {
        tVar3 = none_type;
      }
      else {
        sVar1 = ((args_00.field_1.values_)->field_0).string.size;
        local_278 = (uint)((args_00.field_1.values_)->field_0).ulong_long_value;
        uStack_274 = (undefined4)(((args_00.field_1.values_)->field_0).ulong_long_value >> 0x20);
        uStack_270 = (undefined2)sVar1;
        uStack_26e = (undefined6)(sVar1 >> 0x10);
        tVar3 = (args_00.field_1.args_)->type_;
      }
    }
    else {
      tVar3 = (type)format_str.size_ & custom_type;
      if (((undefined1  [16])format_str & (undefined1  [16])0xf) != (undefined1  [16])0x0) {
        sVar1 = ((args_00.field_1.values_)->field_0).string.size;
        local_278 = (uint)((args_00.field_1.values_)->field_0).ulong_long_value;
        uStack_274 = (undefined4)(((args_00.field_1.values_)->field_0).ulong_long_value >> 0x20);
        uStack_270 = (undefined2)sVar1;
        uStack_26e = (undefined6)(sVar1 >> 0x10);
      }
    }
    if (tVar3 == none_type) {
      error_handler::on_error((error_handler *)__return_storage_ptr__,"argument not found");
    }
    switch(tVar3) {
    case int_type:
      to_string<int,_0>(__return_storage_ptr__,local_278);
      break;
    case uint_type:
      to_string<unsigned_int,_0>(__return_storage_ptr__,local_278);
      break;
    case long_long_type:
      to_string<long_long,_0>(__return_storage_ptr__,CONCAT44(uStack_274,local_278));
      break;
    case ulong_long_type:
      to_string<unsigned_long_long,_0>(__return_storage_ptr__,CONCAT44(uStack_274,local_278));
      break;
    case int128_type:
      local_258._vptr_buffer._0_4_ = local_278;
      local_258._vptr_buffer._4_4_ = uStack_274;
      local_258.ptr_._0_2_ = uStack_270;
      local_258.ptr_._2_6_ = uStack_26e;
      to_string<__int128,_0>(__return_storage_ptr__,(__int128 *)&local_258);
      break;
    case uint128_type:
      local_258._vptr_buffer._0_4_ = local_278;
      local_258._vptr_buffer._4_4_ = uStack_274;
      local_258.ptr_._0_2_ = uStack_270;
      local_258.ptr_._2_6_ = uStack_26e;
      to_string<unsigned___int128,_0>(__return_storage_ptr__,(unsigned___int128 *)&local_258);
      break;
    case bool_type:
      __n = (ulong)(local_278 & 1) ^ 5;
      pcVar2 = "IsValid_false";
      if ((local_278 & 1) != 0) {
        pcVar2 = "IsValid_true";
      }
      memcpy(&local_258,pcVar2 + 8,__n);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,&local_258,(long)&local_258._vptr_buffer + __n);
      break;
    case char_type:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = (char)local_278;
      __return_storage_ptr__->_M_string_length = 1;
      (__return_storage_ptr__->field_2)._M_local_buf[1] = '\0';
      break;
    case float_type:
      local_258._vptr_buffer._0_4_ = local_278;
      to_string<float,_0>(__return_storage_ptr__,(float *)&local_258);
      break;
    case double_type:
      local_258._vptr_buffer._0_4_ = local_278;
      local_258._vptr_buffer._4_4_ = uStack_274;
      to_string<double,_0>(__return_storage_ptr__,(double *)&local_258);
      break;
    case last_numeric_type:
      local_258._vptr_buffer._0_4_ = local_278;
      local_258._vptr_buffer._4_4_ = uStack_274;
      local_258.ptr_._0_2_ = uStack_270;
      to_string<long_double,_0>(__return_storage_ptr__,(longdouble *)&local_258);
      break;
    case cstring_type:
      local_258._vptr_buffer._0_4_ = local_278;
      local_258._vptr_buffer._4_4_ = uStack_274;
      to_string<const_char_*,_0>(__return_storage_ptr__,(char **)&local_258);
      break;
    case string_type:
      local_258._vptr_buffer._0_4_ = local_278;
      local_258._vptr_buffer._4_4_ = uStack_274;
      local_258.ptr_._0_2_ = uStack_270;
      local_258.ptr_._2_6_ = uStack_26e;
      to_string<fmt::v7::basic_string_view<char>,_0>
                (__return_storage_ptr__,(basic_string_view<char> *)&local_258);
      break;
    case pointer_type:
      local_258._vptr_buffer._0_4_ = local_278;
      local_258._vptr_buffer._4_4_ = uStack_274;
      to_string<const_void_*,_0>(__return_storage_ptr__,&local_258._vptr_buffer);
      break;
    case custom_type:
      h.custom_.value._4_4_ = uStack_274;
      h.custom_.value._0_4_ = local_278;
      h.custom_.format._0_2_ = uStack_270;
      h.custom_.format._2_6_ = uStack_26e;
      stringifier::operator()[abi_cxx11_(__return_storage_ptr__,&local_259,h);
      break;
    default:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/format.h"
                  ,0x7d7,"");
    }
  }
  else {
    local_258.size_ = 0;
    local_258._vptr_buffer._0_4_ = 0x7fca68;
    local_258._vptr_buffer._4_4_ = 0;
    local_258.ptr_._0_2_ = SUB82(local_238,0);
    local_258.ptr_._2_6_ = (undefined6)((ulong)local_238 >> 0x10);
    local_258.capacity_ = 500;
    format_str_00.data_ = (char *)this;
    vformat_to<char>(&local_258,format_str_00,args_00,(locale_ref)0x0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,CONCAT62(local_258.ptr_._2_6_,local_258.ptr_._0_2_),
               local_258.size_ + CONCAT62(local_258.ptr_._2_6_,local_258.ptr_._0_2_));
    if ((undefined1 *)CONCAT62(local_258.ptr_._2_6_,local_258.ptr_._0_2_) != local_238) {
      operator_delete((undefined1 *)CONCAT62(local_258.ptr_._2_6_,local_258.ptr_._0_2_),
                      local_258.capacity_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

FMT_FUNC std::string detail::vformat(string_view format_str, format_args args) {
  if (format_str.size() == 2 && equal2(format_str.data(), "{}")) {
    auto arg = args.get(0);
    if (!arg) error_handler().on_error("argument not found");
    return visit_format_arg(stringifier(), arg);
  }
  memory_buffer buffer;
  detail::vformat_to(buffer, format_str, args);
  return to_string(buffer);
}